

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

ostream * __thiscall nivalis::Plotter::export_binary_func_and_env(Plotter *this,ostream *os)

{
  View val;
  ostream *poVar1;
  Function *in_RSI;
  long in_RDI;
  size_t i;
  unsigned_long in_stack_ffffffffffffff78;
  uint val_00;
  ostream *in_stack_ffffffffffffff80;
  Function *this_00;
  Environment *in_stack_ffffffffffffffc0;
  Environment *this_01;
  ostream *poStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  ostream *poVar2;
  ostream *os_00;
  Function *pFVar3;
  
  util::write_bin<unsigned_long>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = in_RSI;
  std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
            ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)(in_RDI + 0x40));
  util::write_bin<unsigned_long>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  poVar2 = (ostream *)0x0;
  while( true ) {
    os_00 = poVar2;
    poVar1 = (ostream *)
             std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                       ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                        (in_RDI + 0x40));
    if (poVar1 <= poVar2) break;
    std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
              ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)(in_RDI + 0x40),
               (size_type)os_00);
    Function::to_bin(this_00,os_00);
    poVar2 = os_00 + 1;
  }
  pFVar3 = this_00;
  memcpy(&stack0xffffffffffffffc0,(void *)(in_RDI + 8),0x28);
  val.xmax = (double)local_30;
  val._0_8_ = poStack_38;
  val.xmin = (double)uStack_28;
  val.ymax = (double)local_20;
  val.ymin = (double)this_00;
  this_01 = in_stack_ffffffffffffffc0;
  util::write_bin<nivalis::Plotter::View>((ostream *)0x148dfb,val);
  val_00 = (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  util::write_bin<unsigned_int>(poStack_38,val_00);
  util::write_bin<unsigned_int>(poStack_38,val_00);
  util::write_bin<unsigned_int>(poStack_38,val_00);
  util::write_bin<unsigned_int>(poStack_38,val_00);
  Environment::to_bin(this_01,(ostream *)in_RSI);
  return (ostream *)pFVar3;
}

Assistant:

std::ostream& Plotter::export_binary_func_and_env(std::ostream& os) const {
    util::write_bin(os, curr_func);
    util::write_bin(os, funcs.size());
    for (size_t i = 0; i < funcs.size(); ++i) {
        funcs[i].to_bin(os);
    }
    util::write_bin(os, view);
    util::write_bin(os, x_var);
    util::write_bin(os, y_var);
    util::write_bin(os, t_var);
    util::write_bin(os, r_var);
    env.to_bin(os);
    return os;
}